

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vad_core.c
# Opt level: O1

int WebRtcVad_CalcVad8khz(VadInstT *inst,int16_t *speech_frame,size_t frame_length)

{
  short den;
  bool bVar1;
  bool bVar2;
  int16_t iVar3;
  ushort uVar4;
  ushort uVar5;
  short sVar6;
  int16_t iVar7;
  int32_t weighted_average_1;
  int32_t iVar8;
  sbyte sVar9;
  short sVar10;
  short sVar11;
  int32_t weighted_average;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  undefined1 *puVar17;
  short sVar18;
  short sVar19;
  uint uVar20;
  long lVar21;
  undefined1 *puVar22;
  uint uVar23;
  ushort uVar24;
  long lVar25;
  long lVar26;
  int16_t *piVar27;
  ushort uVar28;
  ushort uVar29;
  int16_t *piVar30;
  int iVar31;
  int16_t *piVar32;
  int16_t iVar33;
  int16_t *piVar34;
  int16_t feature_vector [6];
  int32_t noise_probability [2];
  int16_t sgprvec [12];
  int16_t ngprvec [12];
  int16_t deltaS [12];
  int16_t deltaN [12];
  int16_t *local_138;
  undefined1 *local_130;
  short *local_128;
  undefined1 *local_120;
  short *local_108;
  int16_t *local_e8;
  int16_t local_dc [6];
  VadInstT *local_d0;
  int16_t *local_c8;
  int16_t *local_c0;
  uint local_b8 [4];
  short local_a8 [16];
  short local_88 [16];
  undefined1 local_68 [32];
  undefined1 local_48 [24];
  
  iVar3 = WebRtcVad_CalculateFeatures(inst,speech_frame,frame_length,local_dc);
  local_88[8] = 0;
  local_88[9] = 0;
  local_88[10] = 0;
  local_88[0xb] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  if (frame_length == 0x50) {
    lVar21 = 0x2d6;
    lVar16 = 0x2d0;
    lVar25 = 0x2ca;
    lVar26 = 0x2c4;
  }
  else if (frame_length == 0xa0) {
    lVar21 = 0x2d8;
    lVar16 = 0x2d2;
    lVar25 = 0x2cc;
    lVar26 = 0x2c6;
  }
  else {
    lVar21 = 0x2da;
    lVar16 = 0x2d4;
    lVar25 = 0x2ce;
    lVar26 = 0x2c8;
  }
  if (10 < iVar3) {
    sVar19 = *(short *)((long)inst->downsampling_filter_states + lVar21 + -4);
    iVar3 = *(int16_t *)((long)inst->downsampling_filter_states + lVar25 + -4);
    iVar7 = *(int16_t *)((long)inst->downsampling_filter_states + lVar26 + -4);
    sVar11 = *(short *)((long)inst->downsampling_filter_states + lVar16 + -4);
    piVar32 = inst->noise_means;
    local_c0 = inst->noise_stds;
    piVar27 = inst->speech_means;
    local_d0 = inst;
    local_e8 = inst->speech_stds;
    lVar16 = 0;
    puVar17 = local_68;
    puVar22 = local_48;
    lVar21 = 0;
    iVar31 = 0;
    bVar2 = false;
    piVar34 = piVar32;
    do {
      lVar25 = 0;
      lVar26 = 0;
      uVar20 = 0;
      uVar23 = 0;
      do {
        iVar8 = WebRtcVad_GaussianProbability
                          (local_dc[lVar21],*(int16_t *)((long)piVar34 + lVar26),
                           *(int16_t *)((long)piVar34 + lVar26 + 0x30),(int16_t *)(puVar22 + lVar26)
                          );
        iVar12 = *(short *)((long)kNoiseDataWeights + lVar16 + lVar26) * iVar8;
        *(int *)((long)local_b8 + lVar25 + 8) = iVar12;
        uVar23 = uVar23 + iVar12;
        iVar8 = WebRtcVad_GaussianProbability
                          (local_dc[lVar21],*(int16_t *)((long)piVar34 + lVar26 + 0x18),
                           *(int16_t *)((long)piVar34 + lVar26 + 0x48),(int16_t *)(puVar17 + lVar26)
                          );
        local_c8 = kSpeechDataWeights;
        iVar12 = *(short *)((long)kSpeechDataWeights + lVar16 + lVar26) * iVar8;
        *(int *)((long)local_b8 + lVar25) = iVar12;
        uVar20 = uVar20 + iVar12;
        lVar26 = lVar26 + 0xc;
        lVar25 = lVar25 + 4;
      } while (lVar26 == 0xc);
      iVar12 = 0x1f;
      iVar15 = 0x1f;
      if (uVar23 != 0) {
        uVar13 = (int)uVar23 >> 0x1f ^ uVar23;
        if (uVar13 == 0) {
          uVar14 = 0x20;
        }
        else {
          uVar14 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          uVar14 = uVar14 ^ 0x1f;
        }
        iVar15 = uVar14 - 1;
      }
      if (uVar20 != 0) {
        uVar13 = (int)uVar20 >> 0x1f ^ uVar20;
        if (uVar13 == 0) {
          uVar14 = 0x20;
        }
        else {
          uVar14 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          uVar14 = uVar14 ^ 0x1f;
        }
        iVar12 = uVar14 - 1;
      }
      sVar6 = kSpectrumWeight[lVar21];
      if ((int)sVar11 < (iVar15 - iVar12) * 4) {
        bVar2 = true;
      }
      sVar10 = (short)(uVar23 >> 0xc);
      if (sVar10 < 1) {
        sVar10 = 0x4000;
        lVar25 = lVar21;
      }
      else {
        iVar8 = WebRtcSpl_DivW32W16((local_b8[2] & 0x3ffff000) << 2,sVar10);
        local_88[lVar21] = (short)iVar8;
        sVar10 = 0x4000 - (short)iVar8;
        lVar25 = lVar21 + 6;
      }
      local_88[lVar25] = sVar10;
      sVar10 = (short)(uVar20 >> 0xc);
      if (0 < sVar10) {
        iVar8 = WebRtcSpl_DivW32W16((local_b8[0] & 0x3ffff000) << 2,sVar10);
        local_a8[lVar21] = (short)iVar8;
        local_a8[lVar21 + 6] = 0x4000 - (short)iVar8;
      }
      iVar31 = iVar31 + (iVar15 - iVar12) * (int)sVar6;
      lVar21 = lVar21 + 1;
      lVar16 = lVar16 + 2;
      puVar17 = puVar17 + 2;
      piVar34 = piVar34 + 1;
      puVar22 = puVar22 + 2;
    } while (lVar21 != 6);
    bVar1 = sVar19 <= iVar31;
    sVar19 = 0x3200;
    uVar28 = 0x2400;
    local_130 = local_48;
    local_108 = local_88;
    local_120 = local_68;
    local_128 = local_a8;
    lVar16 = 0;
    piVar34 = kNoiseDataWeights;
    do {
      uVar4 = WebRtcVad_FindMinimum(local_d0,local_dc[lVar16],(int)lVar16);
      lVar21 = 0;
      uVar20 = 0;
      do {
        uVar20 = uVar20 + (int)*(short *)((long)piVar34 + lVar21) *
                          (int)*(short *)((long)piVar32 + lVar21);
        lVar21 = lVar21 + 0xc;
      } while (lVar21 == 0xc);
      uVar24 = 0x280;
      piVar30 = kMinimumMean;
      lVar25 = 0;
      lVar21 = 0;
      uVar29 = uVar28;
      do {
        sVar11 = *(short *)((long)local_e8 + lVar25 + -0x48);
        sVar6 = (short)((uint)(((int)((uint)uVar4 * 0x100000 + (uVar20 & 0xffffffc0) * -0x400) >>
                               0x10) * 0x4d00) >> 0x10);
        if (bVar2 || bVar1) {
          den = *(short *)((long)local_e8 + lVar25);
          uVar5 = sVar11 + sVar6;
          if ((short)uVar5 <= (short)uVar24) {
            uVar5 = uVar24;
          }
          sVar11 = *(short *)((long)local_e8 + lVar25 + -0x30);
          if (uVar29 <= uVar5) {
            uVar5 = uVar29;
          }
          *(ushort *)((long)local_e8 + lVar25 + -0x48) = uVar5;
          sVar6 = *(short *)((long)local_128 + lVar25);
          sVar10 = *(short *)(local_120 + lVar25);
          sVar18 = (short)(((short)((uint)((int)sVar6 * (int)sVar10) >> 0xb) * 0x199a >> 0x15) + 1U
                          >> 1) + sVar11;
          if (sVar18 <= *piVar30) {
            sVar18 = *piVar30;
          }
          if ((short)(sVar19 + 0x280) <= sVar18) {
            sVar18 = sVar19 + 0x280;
          }
          *(short *)((long)local_e8 + lVar25 + -0x30) = sVar18;
          local_138 = (int16_t *)((long)local_e8 + lVar25);
          iVar31 = ((int)sVar6 >> 2) *
                   (((int)(short)(local_dc[lVar16] -
                                 (short)((uint)(sVar11 * 0x2000 + 0x8000) >> 0x10)) * (int)sVar10 >>
                    3) + -0x1000) >> 4;
          if (iVar31 < 1) {
            iVar8 = WebRtcSpl_DivW32W16(-iVar31,den * 10);
            iVar31 = -iVar8;
          }
          else {
            iVar31 = WebRtcSpl_DivW32W16(iVar31,den * 10);
          }
          sVar9 = 0x18;
          iVar12 = 0x800000;
        }
        else {
          sVar10 = *(short *)((long)local_108 + lVar25);
          sVar18 = *(short *)(local_130 + lVar25);
          uVar5 = (short)((short)((uint)((int)sVar10 * (int)sVar18) >> 0xb) * 0x28f >> 0x16) +
                  sVar6 + sVar11;
          den = *(int16_t *)((long)local_e8 + lVar25 + -0x18);
          if ((short)uVar5 <= (short)uVar24) {
            uVar5 = uVar24;
          }
          if (uVar29 <= uVar5) {
            uVar5 = uVar29;
          }
          *(ushort *)((long)local_e8 + lVar25 + -0x48) = uVar5;
          local_138 = local_c0 + lVar16 + lVar21 * 6;
          iVar31 = (sVar10 * 0x4000 + 0x8000 >> 0x10) *
                   (((int)(short)(local_dc[lVar16] - (sVar11 >> 3)) * (int)sVar18 >> 3) + -0x1000)
                   >> 0xe;
          if (iVar31 < 1) {
            iVar8 = WebRtcSpl_DivW32W16(-iVar31,den);
            iVar31 = -iVar8;
          }
          else {
            iVar31 = WebRtcSpl_DivW32W16(iVar31,den);
          }
          sVar9 = 0x16;
          iVar12 = 0x200000;
        }
        iVar33 = den + (short)(iVar31 * 0x10000 + iVar12 >> sVar9);
        if (iVar33 < 0x181) {
          iVar33 = 0x180;
        }
        *local_138 = iVar33;
        lVar21 = lVar21 + 1;
        uVar29 = uVar29 + 0x80;
        uVar24 = uVar24 + 0x80;
        lVar25 = lVar25 + 0xc;
        piVar30 = piVar30 + 1;
      } while (lVar25 == 0xc);
      lVar21 = 0;
      uVar20 = 0;
      do {
        uVar20 = uVar20 + (int)*(short *)((long)piVar34 + lVar21) *
                          (int)*(short *)((long)piVar32 + lVar21);
        lVar21 = lVar21 + 0xc;
      } while (lVar21 == 0xc);
      lVar21 = 0;
      uVar23 = 0;
      do {
        uVar23 = uVar23 + (int)*(short *)((long)local_c8 + lVar21) *
                          (int)*(short *)((long)piVar27 + lVar21);
        lVar21 = lVar21 + 0xc;
      } while (lVar21 == 0xc);
      sVar19 = (short)(uVar23 >> 9) - (short)(uVar20 >> 9);
      if (sVar19 < kMinimumDifference[lVar16]) {
        iVar31 = (int)(short)(kMinimumDifference[lVar16] - sVar19);
        lVar21 = 0;
        uVar23 = 0;
        do {
          sVar19 = *(short *)((long)piVar27 + lVar21) + (short)((uint)(iVar31 * 0xd) >> 2);
          *(short *)((long)piVar27 + lVar21) = sVar19;
          uVar23 = uVar23 + (int)*(short *)((long)local_c8 + lVar21) * (int)sVar19;
          lVar21 = lVar21 + 0xc;
        } while (lVar21 == 0xc);
        lVar21 = 0;
        uVar20 = 0;
        do {
          sVar19 = *(short *)((long)piVar32 + lVar21) - (short)((uint)(iVar31 * 0xc000) >> 0x10);
          *(short *)((long)piVar32 + lVar21) = sVar19;
          uVar20 = uVar20 + (int)*(short *)((long)piVar34 + lVar21) * (int)sVar19;
          lVar21 = lVar21 + 0xc;
        } while (lVar21 == 0xc);
      }
      sVar19 = kMaximumSpeech[lVar16];
      sVar11 = (short)(uVar23 >> 7);
      if (sVar19 < sVar11) {
        lVar21 = 0;
        do {
          *(short *)((long)piVar27 + lVar21) =
               *(short *)((long)piVar27 + lVar21) + (sVar19 - sVar11);
          lVar21 = lVar21 + 0xc;
        } while (lVar21 == 0xc);
      }
      sVar6 = (short)(uVar20 >> 7);
      sVar11 = kMaximumNoise[lVar16];
      if (sVar11 < sVar6) {
        lVar21 = 0;
        do {
          *(short *)((long)piVar32 + lVar21) = *(short *)((long)piVar32 + lVar21) + (sVar11 - sVar6)
          ;
          lVar21 = lVar21 + 0xc;
        } while (lVar21 == 0xc);
      }
      lVar16 = lVar16 + 1;
      piVar34 = piVar34 + 1;
      piVar32 = piVar32 + 1;
      uVar28 = uVar28 - 0x80;
      local_130 = local_130 + 2;
      local_108 = local_108 + 1;
      local_120 = local_120 + 2;
      local_128 = local_128 + 1;
      local_e8 = local_e8 + 1;
      local_c8 = local_c8 + 1;
      piVar27 = piVar27 + 1;
    } while (lVar16 != 6);
    local_d0->frame_counter = local_d0->frame_counter + 1;
    inst = local_d0;
    if (bVar2 || bVar1) {
      sVar19 = local_d0->num_of_speech + 1;
      local_d0->num_of_speech = sVar19;
      if (6 < sVar19) {
        local_d0->num_of_speech = 6;
        iVar7 = iVar3;
      }
      local_d0->over_hang = iVar7;
      iVar31 = 1;
      goto LAB_001204f8;
    }
  }
  sVar19 = inst->over_hang;
  if (sVar19 < 1) {
    iVar31 = 0;
  }
  else {
    inst->over_hang = sVar19 + -1;
    iVar31 = (int)(short)(sVar19 + 2);
  }
  inst->num_of_speech = 0;
  local_d0 = inst;
LAB_001204f8:
  local_d0->vad = iVar31;
  return iVar31;
}

Assistant:

int WebRtcVad_CalcVad8khz(VadInstT* inst, const int16_t* speech_frame,
                          size_t frame_length)
{
    int16_t feature_vector[kNumChannels], total_power;

    // Get power in the bands
    total_power = WebRtcVad_CalculateFeatures(inst, speech_frame, frame_length,
                                              feature_vector);

    // Make a VAD
    inst->vad = GmmProbability(inst, feature_vector, total_power, frame_length);

    return inst->vad;
}